

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelaunayMST.h
# Opt level: O2

void __thiscall
DelaunayMST::DelaunayMST(DelaunayMST *this,vector<Point2d,_std::allocator<Point2d>_> *points)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  undefined8 *puVar3;
  pointer pPVar4;
  pointer pPVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  EListNode *__s;
  long lVar13;
  int *piVar14;
  Point2d *pPVar15;
  __uniq_ptr_data<DelaunayMST::IndexPoint2d,_std::default_delete<DelaunayMST::IndexPoint2d[]>,_true,_true>
  __s_00;
  undefined4 *puVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  int i;
  long lVar20;
  double dVar21;
  unique_ptr<DelaunayMST::IndexPoint2d[],_std::default_delete<DelaunayMST::IndexPoint2d[]>_> ori;
  
  (this->super_KruskalMST).edges.
  super__Vector_base<KruskalMST::Edge,_std::allocator<KruskalMST::Edge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_KruskalMST).edges.
  super__Vector_base<KruskalMST::Edge,_std::allocator<KruskalMST::Edge>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_KruskalMST).edges.
  super__Vector_base<KruskalMST::Edge,_std::allocator<KruskalMST::Edge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar4 = (points->super__Vector_base<Point2d,_std::allocator<Point2d>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pPVar5 = (points->super__Vector_base<Point2d,_std::allocator<Point2d>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar18 = ((long)pPVar5 - (long)pPVar4) * 2 + 0x20;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar18;
  uVar19 = SUB168(auVar6 * ZEXT816(0xc),0);
  if (SUB168(auVar6 * ZEXT816(0xc),8) != 0) {
    uVar19 = 0xffffffffffffffff;
  }
  __s = (EListNode *)operator_new__(uVar19);
  if (uVar18 != 0) {
    uVar18 = (long)pPVar4 * -0x18 + (long)pPVar5 * 0x18 + 0x174;
    memset(__s,0,(uVar18 - uVar18 % 0xc) + 0xc);
  }
  (this->e)._M_t.
  super___uniq_ptr_impl<DelaunayMST::EListNode,_std::default_delete<DelaunayMST::EListNode[]>_>._M_t
  .super__Tuple_impl<0UL,_DelaunayMST::EListNode_*,_std::default_delete<DelaunayMST::EListNode[]>_>.
  super__Head_base<0UL,_DelaunayMST::EListNode_*,_false>._M_head_impl = __s;
  lVar13 = (long)(points->super__Vector_base<Point2d,_std::allocator<Point2d>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(points->super__Vector_base<Point2d,_std::allocator<Point2d>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 4;
  uVar18 = -(ulong)(lVar13 + 1U >> 0x3e != 0) | lVar13 * 4 + 4U;
  piVar14 = (int *)operator_new__(uVar18);
  memset(piVar14,0,uVar18);
  (this->last)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = piVar14;
  lVar13 = (long)(points->super__Vector_base<Point2d,_std::allocator<Point2d>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(points->super__Vector_base<Point2d,_std::allocator<Point2d>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 4;
  uVar18 = lVar13 * 4 + 4;
  if (0x3fffffffffffffff < lVar13 + 1U) {
    uVar18 = 0xffffffffffffffff;
  }
  piVar14 = (int *)operator_new__(uVar18);
  memset(piVar14,0,uVar18);
  (this->stk)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = piVar14;
  uVar18 = ((long)(points->super__Vector_base<Point2d,_std::allocator<Point2d>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(points->super__Vector_base<Point2d,_std::allocator<Point2d>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 4) + 1;
  uVar18 = -(ulong)(uVar18 >> 0x3c != 0) | uVar18 * 0x10;
  pPVar15 = (Point2d *)operator_new__(uVar18);
  memset(pPVar15,0,uVar18);
  (this->p)._M_t.super___uniq_ptr_impl<Point2d,_std::default_delete<Point2d[]>_>._M_t.
  super__Tuple_impl<0UL,_Point2d_*,_std::default_delete<Point2d[]>_>.
  super__Head_base<0UL,_Point2d_*,_false>._M_head_impl = pPVar15;
  this->eCnt = 1;
  uVar19 = (long)(points->super__Vector_base<Point2d,_std::allocator<Point2d>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(points->super__Vector_base<Point2d,_std::allocator<Point2d>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 4;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar19 + 1;
  (this->super_KruskalMST).n = (int)uVar19;
  uVar18 = SUB168(auVar7 * ZEXT816(0x18),0);
  if (SUB168(auVar7 * ZEXT816(0x18),8) != 0) {
    uVar18 = 0xffffffffffffffff;
  }
  __s_00.
  super___uniq_ptr_impl<DelaunayMST::IndexPoint2d,_std::default_delete<DelaunayMST::IndexPoint2d[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_DelaunayMST::IndexPoint2d_*,_std::default_delete<DelaunayMST::IndexPoint2d[]>_>
  .super__Head_base<0UL,_DelaunayMST::IndexPoint2d_*,_false>._M_head_impl =
       (__uniq_ptr_impl<DelaunayMST::IndexPoint2d,_std::default_delete<DelaunayMST::IndexPoint2d[]>_>
        )operator_new__(uVar18);
  lVar20 = 0;
  memset((void *)__s_00.
                 super___uniq_ptr_impl<DelaunayMST::IndexPoint2d,_std::default_delete<DelaunayMST::IndexPoint2d[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_DelaunayMST::IndexPoint2d_*,_std::default_delete<DelaunayMST::IndexPoint2d[]>_>
                 .super__Head_base<0UL,_DelaunayMST::IndexPoint2d_*,_false>._M_head_impl,0,uVar18);
  puVar16 = (undefined4 *)
            ((long)__s_00.
                   super___uniq_ptr_impl<DelaunayMST::IndexPoint2d,_std::default_delete<DelaunayMST::IndexPoint2d[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_DelaunayMST::IndexPoint2d_*,_std::default_delete<DelaunayMST::IndexPoint2d[]>_>
                   .super__Head_base<0UL,_DelaunayMST::IndexPoint2d_*,_false>._M_head_impl + 0x28);
  for (lVar13 = 1; lVar13 <= (int)uVar19; lVar13 = lVar13 + 1) {
    puVar1 = (undefined8 *)
             ((long)&((points->super__Vector_base<Point2d,_std::allocator<Point2d>_>)._M_impl.
                      super__Vector_impl_data._M_start)->x + lVar20);
    uVar12 = puVar1[1];
    puVar3 = (undefined8 *)
             ((long)&(this->p)._M_t.super___uniq_ptr_impl<Point2d,_std::default_delete<Point2d[]>_>.
                     _M_t.super__Tuple_impl<0UL,_Point2d_*,_std::default_delete<Point2d[]>_>.
                     super__Head_base<0UL,_Point2d_*,_false>._M_head_impl[1].x + lVar20);
    *puVar3 = *puVar1;
    puVar3[1] = uVar12;
    puVar2 = (undefined4 *)
             ((long)&((points->super__Vector_base<Point2d,_std::allocator<Point2d>_>)._M_impl.
                      super__Vector_impl_data._M_start)->x + lVar20);
    uVar9 = puVar2[1];
    uVar10 = puVar2[2];
    uVar11 = puVar2[3];
    puVar16[-4] = *puVar2;
    puVar16[-3] = uVar9;
    puVar16[-2] = uVar10;
    puVar16[-1] = uVar11;
    *puVar16 = (int)lVar13;
    uVar19 = (ulong)(uint)(this->super_KruskalMST).n;
    lVar20 = lVar20 + 0x10;
    puVar16 = puVar16 + 6;
  }
  pPVar15 = (this->p)._M_t.super___uniq_ptr_impl<Point2d,_std::default_delete<Point2d[]>_>._M_t.
            super__Tuple_impl<0UL,_Point2d_*,_std::default_delete<Point2d[]>_>.
            super__Head_base<0UL,_Point2d_*,_false>._M_head_impl;
  ori._M_t.
  super___uniq_ptr_impl<DelaunayMST::IndexPoint2d,_std::default_delete<DelaunayMST::IndexPoint2d[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_DelaunayMST::IndexPoint2d_*,_std::default_delete<DelaunayMST::IndexPoint2d[]>_>
  .super__Head_base<0UL,_DelaunayMST::IndexPoint2d_*,_false>._M_head_impl =
       (__uniq_ptr_data<DelaunayMST::IndexPoint2d,_std::default_delete<DelaunayMST::IndexPoint2d[]>,_true,_true>
        )(__uniq_ptr_data<DelaunayMST::IndexPoint2d,_std::default_delete<DelaunayMST::IndexPoint2d[]>,_true,_true>
          )__s_00.
           super___uniq_ptr_impl<DelaunayMST::IndexPoint2d,_std::default_delete<DelaunayMST::IndexPoint2d[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_DelaunayMST::IndexPoint2d_*,_std::default_delete<DelaunayMST::IndexPoint2d[]>_>
           .super__Head_base<0UL,_DelaunayMST::IndexPoint2d_*,_false>._M_head_impl;
  std::
  __sort<Point2d*,__gnu_cxx::__ops::_Iter_comp_iter<DelaunayMST::DelaunayMST(std::vector<Point2d,std::allocator<Point2d>>const&)::_lambda(auto:1&,auto:2&)_1_>>
            (pPVar15 + 1,pPVar15 + (long)(int)uVar19 + 1);
  std::
  __sort<DelaunayMST::IndexPoint2d*,__gnu_cxx::__ops::_Iter_comp_iter<DelaunayMST::_Iter_comp_iter(std::vector<Point2d,std::allocator<Point2d>>const&)::_lambda(auto:1&,auto:2&)_1_>>
            ((long)__s_00.
                   super___uniq_ptr_impl<DelaunayMST::IndexPoint2d,_std::default_delete<DelaunayMST::IndexPoint2d[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_DelaunayMST::IndexPoint2d_*,_std::default_delete<DelaunayMST::IndexPoint2d[]>_>
                   .super__Head_base<0UL,_DelaunayMST::IndexPoint2d_*,_false>._M_head_impl + 0x18,
             (long)((long)__s_00.
                          super___uniq_ptr_impl<DelaunayMST::IndexPoint2d,_std::default_delete<DelaunayMST::IndexPoint2d[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_DelaunayMST::IndexPoint2d_*,_std::default_delete<DelaunayMST::IndexPoint2d[]>_>
                          .super__Head_base<0UL,_DelaunayMST::IndexPoint2d_*,_false>._M_head_impl +
                   (long)(this->super_KruskalMST).n * 0x18) + 0x18);
  delaunay(this,1,(this->super_KruskalMST).n);
  for (lVar13 = 1; lVar13 <= (this->super_KruskalMST).n; lVar13 = lVar13 + 1) {
    piVar14 = (this->last)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
              super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
              super__Head_base<0UL,_int_*,_false>._M_head_impl + lVar13;
    while (lVar20 = (long)*piVar14, lVar20 != 0) {
      pPVar15 = (this->p)._M_t.super___uniq_ptr_impl<Point2d,_std::default_delete<Point2d[]>_>._M_t.
                super__Tuple_impl<0UL,_Point2d_*,_std::default_delete<Point2d[]>_>.
                super__Head_base<0UL,_Point2d_*,_false>._M_head_impl;
      lVar17 = (long)(this->e)._M_t.
                     super___uniq_ptr_impl<DelaunayMST::EListNode,_std::default_delete<DelaunayMST::EListNode[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_DelaunayMST::EListNode_*,_std::default_delete<DelaunayMST::EListNode[]>_>
                     .super__Head_base<0UL,_DelaunayMST::EListNode_*,_false>._M_head_impl[lVar20].to
      ;
      dVar8 = pPVar15[lVar13].x - pPVar15[lVar17].x;
      dVar21 = pPVar15[lVar13].y - pPVar15[lVar17].y;
      KruskalMST::addEdge(&this->super_KruskalMST,
                          *(int *)((long)ori._M_t.
                                         super___uniq_ptr_impl<DelaunayMST::IndexPoint2d,_std::default_delete<DelaunayMST::IndexPoint2d[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_DelaunayMST::IndexPoint2d_*,_std::default_delete<DelaunayMST::IndexPoint2d[]>_>
                                         .super__Head_base<0UL,_DelaunayMST::IndexPoint2d_*,_false>.
                                         _M_head_impl + 0x10 + lVar13 * 0x18) + -1,
                          *(int *)((long)ori._M_t.
                                         super___uniq_ptr_impl<DelaunayMST::IndexPoint2d,_std::default_delete<DelaunayMST::IndexPoint2d[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_DelaunayMST::IndexPoint2d_*,_std::default_delete<DelaunayMST::IndexPoint2d[]>_>
                                         .super__Head_base<0UL,_DelaunayMST::IndexPoint2d_*,_false>.
                                         _M_head_impl + 0x10 + lVar17 * 0x18) + -1,
                          SQRT(dVar8 * dVar8 + dVar21 * dVar21));
      piVar14 = &(this->e)._M_t.
                 super___uniq_ptr_impl<DelaunayMST::EListNode,_std::default_delete<DelaunayMST::EListNode[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_DelaunayMST::EListNode_*,_std::default_delete<DelaunayMST::EListNode[]>_>
                 .super__Head_base<0UL,_DelaunayMST::EListNode_*,_false>._M_head_impl[lVar20].prev;
    }
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<KruskalMST::Edge*,std::vector<KruskalMST::Edge,std::allocator<KruskalMST::Edge>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((this->super_KruskalMST).edges.
             super__Vector_base<KruskalMST::Edge,_std::allocator<KruskalMST::Edge>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->super_KruskalMST).edges.
             super__Vector_base<KruskalMST::Edge,_std::allocator<KruskalMST::Edge>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::unique_ptr<DelaunayMST::IndexPoint2d[],_std::default_delete<DelaunayMST::IndexPoint2d[]>_>::
  ~unique_ptr(&ori);
  return;
}

Assistant:

DelaunayMST(const std::vector<Point2d> &points)
			: last(new int[points.size() + 1]{}), stk(new int[points.size() + 1]{}),
			  p(new Point2d[points.size() + 1]{}), e(new EListNode[(points.size() + 1) * 32]{})
	{
		n = static_cast<int>(points.size());
		std::unique_ptr<IndexPoint2d[]> ori(new IndexPoint2d[points.size() + 1]{});
		for (int i = 1; i <= n; ++i)
			p[i] = points[i - 1], ori[i] = {points[i - 1], i};

		auto pointCmp = [](auto &lhs, auto &rhs)
		{ return lhs.x < rhs.x || lhs.x == rhs.x && lhs.y < rhs.y; };
		std::sort(p.get() + 1, p.get() + 1 + n, pointCmp);
		std::sort(ori.get() + 1, ori.get() + 1 + n, pointCmp);

		delaunay(1, n);

		for (int i = 1; i <= n; ++i)
			for (int j = last[i]; j; j = e[j].prev)
				addEdge(ori[i].index - 1, ori[e[j].to].index - 1, (p[i] - p[e[j].to]).length());
		std::sort(edges.begin(), edges.end());
	}